

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_io.c
# Opt level: O1

int ARKodeSetStagePredictFn(void *arkode_mem,ARKStagePredictFn PredictStage)

{
  int iVar1;
  int iVar2;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    iVar2 = -0x15;
    arkode_mem = (ARKodeMem)0x0;
    error_code = -0x15;
    iVar1 = 0x333;
  }
  else if (*(int *)((long)arkode_mem + 0x128) == 0) {
    msgfmt = "time-stepping module does not require an algebraic solver";
    iVar2 = -0x30;
    error_code = -0x30;
    iVar1 = 0x33c;
  }
  else {
    if (*(code **)((long)arkode_mem + 0x1c8) != (code *)0x0) {
      iVar1 = (**(code **)((long)arkode_mem + 0x1c8))();
      return iVar1;
    }
    msgfmt = "time-stepping module does not support this function";
    iVar2 = -0x30;
    error_code = -0x30;
    iVar1 = 0x348;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,iVar1,"ARKodeSetStagePredictFn",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_io.c"
                  ,msgfmt);
  return iVar2;
}

Assistant:

int ARKodeSetStagePredictFn(void* arkode_mem, ARKStagePredictFn PredictStage)
{
  ARKodeMem ark_mem;
  if (arkode_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return (ARK_MEM_NULL);
  }
  ark_mem = (ARKodeMem)arkode_mem;

  /* Guard against use for time steppers that do not need an algebraic solver */
  if (!ark_mem->step_supports_implicit)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not require an algebraic solver");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  /* Call stepper routine (if provided) */
  if (ark_mem->step_setstagepredictfn)
  {
    return (ark_mem->step_setstagepredictfn(arkode_mem, PredictStage));
  }
  else
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__,
                    "time-stepping module does not support this function");
    return (ARK_STEPPER_UNSUPPORTED);
  }
}